

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LookaheadDFA.hpp
# Opt level: O2

void __thiscall
Centaurus::LookaheadDFA<unsigned_char>::fork_closures
          (LookaheadDFA<unsigned_char> *this,CompositeATN<unsigned_char> *catn,int index)

{
  int iVar1;
  ulong uVar2;
  uint i;
  pointer cc;
  CATNDepartureSet<unsigned_char> deptset;
  CATNClosure ec;
  
  CompositeATN<unsigned_char>::build_departure_set
            (&deptset,catn,
             &(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
              super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start[index].
              super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
              .m_label);
  uVar2 = ((long)(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                 super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x50;
  for (cc = deptset.
            super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
            .
            super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      cc != deptset.
            super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
            .
            super__Vector_base<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish; cc = cc + 1) {
    iVar1 = get_closure_color(&cc->second);
    if (iVar1 < 1) {
      CompositeATN<unsigned_char>::build_closure((CATNClosure *)&ec._M_t,catn,&cc->second);
      iVar1 = add_state(this,(CATNClosure *)&ec._M_t);
      NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ::add_transition(&(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                        super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[index].
                        super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                       ,&cc->first,iVar1,false);
      std::
      _Rb_tree<Centaurus::CATNClosureElement,_Centaurus::CATNClosureElement,_std::_Identity<Centaurus::CATNClosureElement>,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>
      ::~_Rb_tree(&ec._M_t);
    }
    else {
      NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
      ::add_transition(&(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                        super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[index].
                        super_NFABaseState<unsigned_char,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>
                       ,&cc->first,-iVar1,false);
    }
  }
  for (; (uVar2 & 0xffffffff) <
         (ulong)(((long)(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                        super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->super_NFABase<Centaurus::LDFAState<unsigned_char>_>).m_states.
                       super__Vector_base<Centaurus::LDFAState<unsigned_char>,_std::allocator<Centaurus::LDFAState<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x50);
      uVar2 = (ulong)((int)uVar2 + 1)) {
    fork_closures(this,catn,(int)uVar2);
  }
  std::
  vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
  ::~vector(&deptset.
             super_vector<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>,_std::allocator<std::pair<Centaurus::CharClass<unsigned_char>,_std::set<Centaurus::CATNClosureElement,_std::less<Centaurus::CATNClosureElement>,_std::allocator<Centaurus::CATNClosureElement>_>_>_>_>
           );
  return;
}

Assistant:

void fork_closures(const CompositeATN<TCHAR>& catn, int index)
	{
		const LDFAState<TCHAR>& state = m_states[index];

		//First, check if the state in question is already single-colored
		/*if (state.get_color() > 0)
		{
			std::cout << "Monochromatic " << index << std::endl;
			return;
		}*/

		CATNDepartureSet<TCHAR> deptset = catn.build_departure_set(state.label());

		/*std::wofstream deptsetLog("deptset.log", std::ios::app);

		deptsetLog << deptset << std::endl;

		deptsetLog.close();*/

		//std::cout << deptset << std::endl;

		//Add new states to the LDFA
		int initial_index = m_states.size();

		for (const auto& item : deptset)
		{
			int color = get_closure_color(item.second);

			if (color > 0)
			{
				m_states[index].add_transition(item.first, -color);
			}
			else
			{
				CATNClosure ec = catn.build_closure(item.second);

				int new_index = add_state(ec);

				m_states[index].add_transition(item.first, new_index);
			}
		}

		//Recursively construct the closures for all the newly added DFA states
		for (unsigned int i = initial_index; i < m_states.size(); i++)
		{
			fork_closures(catn, i);
		}
	}